

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlastdiff_s.c
# Opt level: O1

errno_t strlastdiff_s(char *dest,rsize_t dmax,char *src,rsize_t *index)

{
  long lVar1;
  bool bVar2;
  errno_t error;
  errno_t eVar3;
  char *msg;
  rsize_t rVar4;
  char cVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (index == (rsize_t *)0x0) {
    msg = "strlastdiff_s: index is null";
LAB_00105ca1:
    eVar3 = 400;
    error = 400;
  }
  else {
    *index = 0;
    if (dest == (char *)0x0) {
      msg = "strlastdiff_s: dest is null";
      goto LAB_00105ca1;
    }
    if (src == (char *)0x0) {
      msg = "strlastdiff_s: src is null";
      goto LAB_00105ca1;
    }
    if (dmax == 0) {
      msg = "strlastdiff_s: dmax is 0";
      eVar3 = 0x191;
      error = 0x191;
    }
    else {
      if (dmax < 0x10000001) {
        cVar5 = *dest;
        if (cVar5 == '\0') {
          eVar3 = 0x198;
        }
        else {
          rVar4 = 0;
          bVar2 = false;
          do {
            if ((src[rVar4] == '\0') || (dmax == rVar4)) break;
            if (cVar5 != src[rVar4]) {
              *index = rVar4;
              bVar2 = true;
            }
            cVar5 = dest[rVar4 + 1];
            rVar4 = rVar4 + 1;
          } while (cVar5 != '\0');
          eVar3 = 0x198;
          if (bVar2) {
            eVar3 = 0;
          }
        }
        goto LAB_00105cb2;
      }
      msg = "strlastdiff_s: dmax exceeds max";
      eVar3 = 0x193;
      error = 0x193;
    }
  }
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_00105cb2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return eVar3;
}

Assistant:

errno_t
strlastdiff_s(const char *dest, rsize_t dmax,
              const char *src, rsize_t *index)
{
    const char *rp;
    bool there_is_a_diff = false;

    if (index == NULL) {
        invoke_safe_str_constraint_handler("strlastdiff_s: index is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }
    *index = 0;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strlastdiff_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strlastdiff_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0 ) {
        invoke_safe_str_constraint_handler("strlastdiff_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strlastdiff_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /* hold reference point */
    rp = dest;

    /*
     * find the last diff
     */
    while (*dest && *src && dmax) {

        if (*dest != *src) {
            there_is_a_diff = true;
            *index = dest - rp;
        }

        dest++;
        src++;
        dmax--;
    }

    if (there_is_a_diff) {
        return (EOK);
    } else {
        return (ESNODIFF);
    }
}